

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

aiMesh * __thiscall Assimp::ColladaLoader::findMesh(ColladaLoader *this,string *meshid)

{
  char *pcVar1;
  aiMesh *paVar2;
  int iVar3;
  aiMesh *in_RAX;
  size_t sVar4;
  aiMesh *extraout_RAX;
  pointer ppaVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  aiMesh *local_50;
  size_t local_48;
  long local_40;
  
  ppaVar5 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar9 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppaVar5;
  if (bVar9) {
    uVar7 = 1;
    uVar8 = 0;
    do {
      paVar2 = ppaVar5[uVar8];
      pcVar1 = (paVar2->mName).data;
      local_50 = (aiMesh *)&stack0xffffffffffffffc0;
      sVar4 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar1,(paVar2->mName).data + sVar4);
      if (local_48 == meshid->_M_string_length) {
        if (local_48 == 0) {
          bVar10 = true;
        }
        else {
          iVar3 = bcmp(local_50,(meshid->_M_dataplus)._M_p,local_48);
          bVar10 = iVar3 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      in_RAX = (aiMesh *)&stack0xffffffffffffffc0;
      if (local_50 != in_RAX) {
        operator_delete(local_50,local_40 + 1);
        in_RAX = extraout_RAX;
      }
      if (bVar10) {
        in_RAX = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        break;
      }
      uVar8 = (ulong)uVar7;
      ppaVar5 = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppaVar5 >> 3;
      uVar7 = uVar7 + 1;
      bVar9 = uVar8 < uVar6;
    } while (uVar8 < uVar6);
  }
  if (!bVar9) {
    ppaVar5 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppaVar5) {
      uVar7 = 1;
      uVar8 = 0;
      do {
        paVar2 = ppaVar5[uVar8];
        pcVar1 = (paVar2->mName).data;
        local_50 = (aiMesh *)&stack0xffffffffffffffc0;
        sVar4 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pcVar1,(paVar2->mName).data + sVar4);
        if (local_48 == meshid->_M_string_length) {
          if (local_48 == 0) {
            bVar9 = true;
          }
          else {
            iVar3 = bcmp(local_50,(meshid->_M_dataplus)._M_p,local_48);
            bVar9 = iVar3 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if (local_50 != (aiMesh *)&stack0xffffffffffffffc0) {
          operator_delete(local_50,local_40 + 1);
        }
        if (bVar9) {
          return (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8];
        }
        uVar8 = (ulong)uVar7;
        ppaVar5 = (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar7 = uVar7 + 1;
      } while (uVar8 < (ulong)((long)(this->mTargetMeshes).
                                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                                     .super__Vector_impl_data._M_finish - (long)ppaVar5 >> 3));
    }
    in_RAX = (aiMesh *)0x0;
  }
  return in_RAX;
}

Assistant:

aiMesh *ColladaLoader::findMesh(const std::string& meshid) {
    for (unsigned int i = 0; i < mMeshes.size(); ++i) {
        if (std::string(mMeshes[i]->mName.data) == meshid) {
            return mMeshes[i];
        }
    }

    for (unsigned int i = 0; i < mTargetMeshes.size(); ++i) {
        if (std::string(mTargetMeshes[i]->mName.data) == meshid) {
            return mTargetMeshes[i];
        }
    }

    return nullptr;
}